

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualTo.hpp
# Opt level: O2

string * __thiscall
ut11::Operands::EqualTo<std::__cxx11::string>::GetErrorMessage<std::__cxx11::string>
          (string *__return_storage_ptr__,EqualTo<std::__cxx11::string> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual)

{
  ostream *poVar1;
  stringstream errorMessage;
  string asStack_1e8 [32];
  string local_1c8 [32];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,"Expected ");
  std::__cxx11::string::string(local_1c8,*(string **)this);
  poVar1 = std::operator<<(poVar1,local_1c8);
  poVar1 = std::operator<<(poVar1," but was ");
  std::__cxx11::string::string(asStack_1e8,(string *)actual);
  std::operator<<(poVar1,asStack_1e8);
  std::__cxx11::string::~string(asStack_1e8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

inline std::string GetErrorMessage(const T& actual) const
			{
				std::stringstream errorMessage;
				errorMessage << "Expected " << utility::ToString(m_expected) << " but was " << utility::ToString(actual);
				return errorMessage.str();
			}